

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O1

char * cmSHA512_Data(sha_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  SHA_CTX context;
  SHA_CTX local_f8;
  
  local_f8.s512.state[6] = 0x1f83d9abfb41bd6b;
  local_f8.s512.state[7] = 0x5be0cd19137e2179;
  local_f8.s256.bitcount = 0x510e527fade682d1;
  local_f8.s512.state[5] = 0x9b05688c2b3e6c1f;
  local_f8.s512.state[2] = 0x3c6ef372fe94f82b;
  local_f8.s1.bitcount = 0xa54ff53a5f1d36f1;
  local_f8.s512.state[0] = 0x6a09e667f3bcc908;
  local_f8.s512.state[1] = 0xbb67ae8584caa73b;
  memset(local_f8.s1.buffer + 0x20,0,0x90);
  cmSHA512_Update(&local_f8,data,len);
  pcVar1 = cmSHA512_End(&local_f8,digest);
  return pcVar1;
}

Assistant:

char* SHA512_Data(const sha_byte* data, size_t len, char digest[SHA512_DIGEST_STRING_LENGTH]) {
	SHA_CTX	context;

	SHA512_Init(&context);
	SHA512_Update(&context, data, len);
	return SHA512_End(&context, digest);
}